

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlfparser.h
# Opt level: O2

vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *
xlfparser::tokenize<wchar_t>
          (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *__return_storage_ptr__,
          wchar_t *formula,size_t size,Options<wchar_t> *options)

{
  _Storage<wchar_t,_true> _Var1;
  wchar_t *pwVar2;
  pointer pTVar3;
  bool bVar4;
  wostream *pwVar5;
  size_t sVar6;
  _Elt_pointer pTVar7;
  pointer pcVar8;
  invalid_formula *piVar9;
  wchar_t wVar10;
  wchar_t *pwVar11;
  wchar_t wVar12;
  undefined **ppuVar13;
  bool bVar14;
  pointer pcVar15;
  pointer pcVar16;
  bool bVar17;
  bool bVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  pointer local_2a8;
  string local_2a0;
  allocator<char> local_279;
  pointer local_278;
  _Storage<wchar_t,_true> local_270;
  _Storage<wchar_t,_true> local_26c;
  _Storage<wchar_t,_true> local_268;
  _Storage<wchar_t,_true> local_264;
  wchar_t *local_260;
  vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *local_258;
  _Storage<wchar_t,_true> local_250;
  _Storage<wchar_t,_true> local_24c;
  stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
  stack;
  _Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_> local_1f0;
  basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_> sn_regex;
  basic_stringstream<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> sn_regex_ss;
  wostream local_1a8 [376];
  
  if ((size < 2) || (*formula != L'=')) {
    piVar9 = (invalid_formula *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sn_regex_ss,"Invalid Excel formula",(allocator<char> *)&stack);
    invalid_formula::invalid_formula(piVar9,(string *)&sn_regex_ss);
    __cxa_throw(piVar9,&invalid_formula::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((options->left_brace).super__Optional_base<wchar_t,_true,_true>._M_payload.
      super__Optional_payload_base<wchar_t>._M_engaged == false) {
    local_268._M_value = L'{';
  }
  else {
    local_268 = (options->left_brace).super__Optional_base<wchar_t,_true,_true>._M_payload.
                super__Optional_payload_base<wchar_t>._M_payload;
  }
  if ((options->left_bracket).super__Optional_base<wchar_t,_true,_true>._M_payload.
      super__Optional_payload_base<wchar_t>._M_engaged == false) {
    local_264._M_value = L'[';
  }
  else {
    local_264 = (options->left_bracket).super__Optional_base<wchar_t,_true,_true>._M_payload.
                super__Optional_payload_base<wchar_t>._M_payload;
  }
  bVar17 = (options->right_brace).super__Optional_base<wchar_t,_true,_true>._M_payload.
           super__Optional_payload_base<wchar_t>._M_engaged != false;
  _Var1 = (options->right_brace).super__Optional_base<wchar_t,_true,_true>._M_payload.
          super__Optional_payload_base<wchar_t>._M_payload;
  local_250._M_value = L'}';
  if (bVar17) {
    local_250 = _Var1;
  }
  local_24c._M_value = L']';
  if (bVar17) {
    local_24c = _Var1;
  }
  if ((options->list_separator).super__Optional_base<wchar_t,_true,_true>._M_payload.
      super__Optional_payload_base<wchar_t>._M_engaged == false) {
    local_270._M_value = L',';
  }
  else {
    local_270 = (options->list_separator).super__Optional_base<wchar_t,_true,_true>._M_payload.
                super__Optional_payload_base<wchar_t>._M_payload;
  }
  if ((options->row_separator).super__Optional_base<wchar_t,_true,_true>._M_payload.
      super__Optional_payload_base<wchar_t>._M_engaged == false) {
    local_26c._M_value = L';';
  }
  else {
    local_26c = (options->row_separator).super__Optional_base<wchar_t,_true,_true>._M_payload.
                super__Optional_payload_base<wchar_t>._M_payload;
  }
  wVar10 = (options->decimal_separator).super__Optional_base<wchar_t,_true,_true>._M_payload.
           super__Optional_payload_base<wchar_t>._M_payload._M_value;
  bVar17 = (options->decimal_separator).super__Optional_base<wchar_t,_true,_true>._M_payload.
           super__Optional_payload_base<wchar_t>._M_engaged;
  local_278 = (pointer)size;
  local_260 = formula;
  std::__cxx11::wstringstream::wstringstream((wstringstream *)&sn_regex_ss);
  pwVar5 = std::operator<<(local_1a8,"^[1-9](\\");
  wVar12 = L'.';
  if (bVar17 != false) {
    wVar12 = wVar10;
  }
  pwVar5 = std::operator<<(pwVar5,wVar12);
  std::operator<<(pwVar5,"\\d+)?E[+-]\\d*$");
  std::__cxx11::wstringbuf::str();
  std::__cxx11::basic_regex<wchar_t,std::__cxx11::regex_traits<wchar_t>>::
  basic_regex<std::char_traits<wchar_t>,std::allocator<wchar_t>>
            ((basic_regex<wchar_t,std::__cxx11::regex_traits<wchar_t>> *)&sn_regex,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&stack,
             0x11);
  std::__cxx11::wstring::~wstring((wstring *)&stack);
  (__return_storage_ptr__->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258 = __return_storage_ptr__;
  std::
  stack<xlfparser::Token::Type,std::deque<xlfparser::Token::Type,std::allocator<xlfparser::Token::Type>>>
  ::stack<std::deque<xlfparser::Token::Type,std::allocator<xlfparser::Token::Type>>,void>(&stack);
  pcVar15 = (pointer)0x1;
LAB_0016021a:
  bVar4 = false;
  bVar18 = false;
  bVar17 = false;
  local_2a8 = pcVar15;
  bVar14 = false;
LAB_0016022e:
  while( true ) {
    pcVar16 = pcVar15;
    pwVar11 = local_260;
    pcVar15 = local_278;
    if ((local_278 <= pcVar16) || (wVar10 = local_260[(long)pcVar16], wVar10 == L'\0')) {
      if ((local_2a8 < pcVar16) &&
         ((pTVar3 = (__return_storage_ptr__->
                    super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>)._M_impl
                    .super__Vector_impl_data._M_finish,
          (__return_storage_ptr__->
          super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>)._M_impl.
          super__Vector_impl_data._M_start == pTVar3 || ((pointer)pTVar3[-1].m_end < local_2a8)))) {
        local_2a0._M_string_length = (size_type)(pcVar16 + -1);
        local_2a0._M_dataplus._M_p = local_2a8;
        local_2a0.field_2._M_allocated_capacity = 1;
        std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
        emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
      }
      std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::vector
                ((vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)&local_1f0,
                 __return_storage_ptr__);
      _fix_whitespace_tokens<wchar_t>
                ((vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)&local_2a0,
                 (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)&local_1f0,pwVar11,
                 (size_t)pcVar15);
      std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::_M_move_assign
                (__return_storage_ptr__,&local_2a0);
      std::_Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>::~_Vector_base
                ((_Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)&local_2a0);
      std::_Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>::~_Vector_base
                (&local_1f0);
      _infer_token_subtypes<wchar_t>(__return_storage_ptr__,options,pwVar11,(size_t)pcVar15);
      std::_Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::
      ~_Deque_base((_Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_> *)
                   &stack);
      std::__cxx11::basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_>::~basic_regex
                (&sn_regex);
      std::__cxx11::wstringstream::~wstringstream((wstringstream *)&sn_regex_ss);
      return __return_storage_ptr__;
    }
    pwVar11 = local_260 + (long)pcVar16;
    if (!bVar4) break;
    if (wVar10 == L'\"') {
      if ((local_278 < pcVar16 + 2) || (bVar4 = true, pcVar15 = pcVar16 + 2, pwVar11[1] != L'\"')) {
        local_2a0._M_dataplus._M_p = local_2a8;
        local_2a0.field_2._M_allocated_capacity = 0x300000001;
        local_2a0._M_string_length = (size_type)pcVar16;
        std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
        emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
LAB_001602a6:
        bVar4 = false;
        local_2a8 = pcVar16 + 1;
        pcVar15 = local_2a8;
      }
    }
    else {
      bVar4 = true;
      pcVar15 = pcVar16 + 1;
    }
  }
  if (bVar14) {
    if ((wVar10 == L'\'') && (pcVar16 + 2 <= local_278)) goto code_r0x001602cc;
    goto LAB_001602db;
  }
  if (bVar18) {
    bVar18 = wVar10 != local_24c._M_value;
    bVar4 = false;
    bVar14 = false;
    pcVar15 = pcVar16 + 1;
    goto LAB_0016022e;
  }
  pwVar2 = local_260 + (long)local_2a8;
  if (bVar17) {
    pcVar15 = pcVar16 + 1;
    ppuVar13 = &PTR_anon_var_dwarf_153f4c_001a9870;
    while (pwVar11 = (wchar_t *)*ppuVar13, pwVar11 != (wchar_t *)0x0) {
      sVar6 = wcslen(pwVar11);
      bVar17 = _str_equals(pwVar11,sVar6,pwVar2,(long)pcVar15 - (long)local_2a8);
      __return_storage_ptr__ = local_258;
      ppuVar13 = ppuVar13 + 1;
      if (bVar17) {
        local_2a0._M_dataplus._M_p = local_2a8;
        local_2a0.field_2._M_allocated_capacity = 0x600000001;
        local_2a0._M_string_length = (size_type)pcVar16;
        std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
        emplace_back<xlfparser::Token>(local_258,(Token *)&local_2a0);
        goto LAB_0016021a;
      }
    }
    bVar17 = true;
    bVar4 = false;
    bVar14 = false;
    bVar18 = false;
    __return_storage_ptr__ = local_258;
    goto LAB_0016022e;
  }
  if (local_2a8 < pcVar16) {
    bVar17 = std::regex_match<wchar_t_const*,wchar_t,std::__cxx11::regex_traits<wchar_t>>
                       (pwVar2,pwVar11 + 1,&sn_regex,0);
    if (!bVar17) {
      wVar10 = *pwVar11;
      goto LAB_001603a9;
    }
LAB_00160388:
    bVar4 = false;
LAB_001603e3:
    bVar14 = false;
LAB_0016041b:
    bVar18 = false;
  }
  else {
LAB_001603a9:
    if (wVar10 == L'\'') {
      if (local_2a8 < pcVar16) {
        local_2a0._M_string_length = (size_type)(pcVar16 + -1);
        local_2a0._M_dataplus._M_p = local_2a8;
        local_2a0.field_2._M_allocated_capacity = 0;
        std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
        emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
        local_2a8 = pcVar16;
      }
      bVar14 = true;
      bVar4 = false;
      goto LAB_0016041b;
    }
    if (wVar10 == L'\"') {
      if (local_2a8 < pcVar16) {
        local_2a0._M_string_length = (size_type)(pcVar16 + -1);
        local_2a0._M_dataplus._M_p = local_2a8;
        local_2a0.field_2._M_allocated_capacity = 0;
        std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
        emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
        local_2a8 = pcVar16;
      }
      bVar4 = true;
      goto LAB_001603e3;
    }
    if (wVar10 != local_264._M_value) {
      if (wVar10 != L'#') {
        if (wVar10 == local_268._M_value) {
          if (local_2a8 < pcVar16) {
            local_2a0._M_string_length = (size_type)(pcVar16 + -1);
            local_2a0._M_dataplus._M_p = local_2a8;
            local_2a0.field_2._M_allocated_capacity = 0;
            std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
            emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
            local_2a8 = pcVar16;
          }
          local_2a0.field_2._M_allocated_capacity = 0x100000003;
          local_2a0._M_dataplus._M_p = local_2a8;
          local_2a0._M_string_length = (size_type)pcVar16;
          std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
          emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
          local_2a0.field_2._M_allocated_capacity = 0x100000004;
          local_2a0._M_dataplus._M_p = local_2a8;
          local_2a0._M_string_length = (size_type)pcVar16;
          std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
          emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
          local_2a0._M_dataplus._M_p._0_4_ = 3;
          std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::
          emplace_back<xlfparser::Token::Type>(&stack.c,(Type *)&local_2a0);
          local_2a0._M_dataplus._M_p._0_4_ = 4;
          std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::
          emplace_back<xlfparser::Token::Type>(&stack.c,(Type *)&local_2a0);
        }
        else {
          if ((wVar10 == local_26c._M_value) &&
             (stack.c.
              super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur !=
              stack.c.
              super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>.
              _M_impl.super__Deque_impl_data._M_start._M_cur)) {
            pTVar7 = stack.c.
                     super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (stack.c.
                super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur ==
                stack.c.
                super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first) {
              pTVar7 = stack.c.
                       super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
            }
            if (pTVar7[-1] == ArrayRow) {
              if (local_2a8 < pcVar16) {
                local_2a0._M_string_length = (size_type)(pcVar16 + -1);
                local_2a0._M_dataplus._M_p = local_2a8;
                local_2a0.field_2._M_allocated_capacity = 1;
                std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
                local_2a8 = pcVar16;
              }
              pTVar7 = stack.c.
                       super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (stack.c.
                  super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  stack.c.
                  super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                pTVar7 = stack.c.
                         super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
              }
              local_2a0._M_dataplus._M_p = local_2a8;
              local_2a0.field_2._M_allocated_capacity._4_4_ = 2;
              local_2a0.field_2._M_allocated_capacity._0_4_ = pTVar7[-1];
              local_2a0._M_string_length = (size_type)pcVar16;
              std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
              emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
              std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::pop_back
                        (&stack.c);
              local_2a0._M_dataplus._M_p = local_2a8;
              local_2a0.field_2._M_allocated_capacity = 0x100000004;
              local_2a0._M_string_length = (size_type)pcVar16;
              std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
              emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
              local_2a0._M_dataplus._M_p._0_4_ = 4;
              std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::
              emplace_back<xlfparser::Token::Type>(&stack.c,(Type *)&local_2a0);
              goto LAB_001609e2;
            }
          }
          if (wVar10 == local_250._M_value) {
            if (local_2a8 < pcVar16) {
              local_2a0._M_string_length = (size_type)(pcVar16 + -1);
              local_2a0._M_dataplus._M_p = local_2a8;
              local_2a0.field_2._M_allocated_capacity = 1;
              std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
              emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
              local_2a8 = pcVar16;
            }
            if (stack.c.
                super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur ==
                stack.c.
                super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>.
                _M_impl.super__Deque_impl_data._M_start._M_cur) {
              piVar9 = (invalid_formula *)__cxa_allocate_exception(0x10);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_2a0,"Mismatched braces",&local_279);
              invalid_formula::invalid_formula(piVar9,&local_2a0);
              __cxa_throw(piVar9,&invalid_formula::typeinfo,std::runtime_error::~runtime_error);
            }
            pTVar7 = stack.c.
                     super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (stack.c.
                super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur ==
                stack.c.
                super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first) {
              pTVar7 = stack.c.
                       super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
            }
            local_2a0._M_dataplus._M_p = local_2a8;
            local_2a0.field_2._M_allocated_capacity._4_4_ = 2;
            local_2a0.field_2._M_allocated_capacity._0_4_ = pTVar7[-1];
            local_2a0._M_string_length = (size_type)pcVar16;
            std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
            emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
            std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::pop_back
                      (&stack.c);
            pTVar7 = stack.c.
                     super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (stack.c.
                super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur ==
                stack.c.
                super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first) {
              pTVar7 = stack.c.
                       super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
            }
            local_2a0._M_dataplus._M_p = local_2a8;
            local_2a0.field_2._M_allocated_capacity._4_4_ = 2;
            local_2a0.field_2._M_allocated_capacity._0_4_ = pTVar7[-1];
            local_2a0._M_string_length = (size_type)pcVar16;
            std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
            emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
LAB_00160754:
            std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::pop_back
                      (&stack.c);
          }
          else {
            if (wVar10 == L' ') {
              pcVar8 = local_278;
              pwVar11 = local_260;
              if (local_2a8 < pcVar16) {
                local_2a0._M_string_length = (size_type)(pcVar16 + -1);
                local_2a0._M_dataplus._M_p = local_2a8;
                local_2a0.field_2._M_allocated_capacity = 1;
                std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
                pcVar8 = local_278;
                pwVar11 = local_260;
                local_2a8 = pcVar16;
              }
              goto LAB_00160b1d;
            }
            pcVar15 = pcVar16 + 2;
            if (pcVar15 <= local_278) {
              ppuVar13 = &PTR_anon_var_dwarf_153fd0_001a98c0;
              while (pwVar2 = (wchar_t *)*ppuVar13, pwVar2 != (wchar_t *)0x0) {
                sVar6 = wcslen(pwVar2);
                bVar17 = _str_equals(pwVar2,sVar6,pwVar11,2);
                ppuVar13 = ppuVar13 + 1;
                if (bVar17) {
                  if (local_2a8 < pcVar16) {
                    local_2a0._M_string_length = (size_type)(pcVar16 + -1);
                    local_2a0._M_dataplus._M_p = local_2a8;
                    local_2a0.field_2._M_allocated_capacity = 1;
                    std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                    emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
                    local_2a8 = pcVar16;
                  }
                  local_2a0._M_string_length = (size_type)(pcVar16 + 1);
                  local_2a0.field_2._M_allocated_capacity = 0x500000008;
                  local_2a0._M_dataplus._M_p = local_2a8;
                  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                  emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
                  goto LAB_0016021a;
                }
              }
            }
            wVar10 = *pwVar11;
            pwVar11 = L"+-*/^&=><@";
            do {
              wVar12 = *pwVar11;
              if (wVar12 == L'\0') {
                if (wVar10 == L'%') {
                  local_2a0._M_dataplus._M_p = local_2a8;
                  if (local_2a8 < pcVar16) {
                    local_2a0._M_string_length = (size_type)(pcVar16 + -1);
                    local_2a0.field_2._M_allocated_capacity = 1;
                    std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                    emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
                    local_2a0._M_dataplus._M_p = pcVar16;
                  }
                  local_2a0.field_2._M_allocated_capacity = 9;
                  local_2a0._M_string_length = (size_type)pcVar16;
                  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                  emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
                  goto LAB_001609e2;
                }
                if (wVar10 == L'(') {
                  if (local_2a8 < pcVar16) {
                    local_2a0._M_string_length = (size_type)(pcVar16 + -1);
                    local_2a0._M_dataplus._M_p = local_2a8;
                    local_2a0.field_2._M_allocated_capacity = 0x100000002;
                    std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                    emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
                    local_2a0._M_dataplus._M_p._0_4_ = 2;
                    std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::
                    emplace_back<xlfparser::Token::Type>(&stack.c,(Type *)&local_2a0);
                  }
                  else {
                    local_2a0._M_dataplus._M_p = local_2a8;
                    local_2a0.field_2._M_allocated_capacity = 0x100000005;
                    local_2a0._M_string_length = (size_type)pcVar16;
                    std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                    emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
                    local_2a0._M_dataplus._M_p._0_4_ = 5;
                    std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::
                    emplace_back<xlfparser::Token::Type>(&stack.c,(Type *)&local_2a0);
                  }
                  goto LAB_001609e2;
                }
                if (wVar10 != local_270._M_value) {
                  if (wVar10 != L')') goto LAB_00160388;
                  if (local_2a8 < pcVar16) {
                    local_2a0._M_string_length = (size_type)(pcVar16 + -1);
                    local_2a0._M_dataplus._M_p = local_2a8;
                    local_2a0.field_2._M_allocated_capacity = 1;
                    std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                    emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
                    local_2a8 = pcVar16;
                  }
                  if (stack.c.
                      super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                      stack.c.
                      super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
                    piVar9 = (invalid_formula *)__cxa_allocate_exception(0x10);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_2a0,"Mismatched parentheses",&local_279);
                    invalid_formula::invalid_formula(piVar9,&local_2a0);
                    __cxa_throw(piVar9,&invalid_formula::typeinfo,std::runtime_error::~runtime_error
                               );
                  }
                  pTVar7 = stack.c.
                           super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
                  if (stack.c.
                      super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                      stack.c.
                      super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                    pTVar7 = stack.c.
                             super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
                  }
                  local_2a0._M_dataplus._M_p = local_2a8;
                  local_2a0.field_2._M_allocated_capacity._4_4_ = 2;
                  local_2a0.field_2._M_allocated_capacity._0_4_ = pTVar7[-1];
                  local_2a0._M_string_length = (size_type)pcVar16;
                  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                  emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
                  goto LAB_00160754;
                }
                if (local_2a8 < pcVar16) {
                  local_2a0._M_string_length = (size_type)(pcVar16 + -1);
                  local_2a0._M_dataplus._M_p = local_2a8;
                  local_2a0.field_2._M_allocated_capacity = 1;
                  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                  emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
                  local_2a8 = pcVar16;
                }
                if (stack.c.
                    super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    stack.c.
                    super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur) {
LAB_00160982:
                  uVar19 = 8;
                  uVar20 = 0xb;
                }
                else {
                  pTVar7 = stack.c.
                           super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
                  if (stack.c.
                      super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                      stack.c.
                      super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                    pTVar7 = stack.c.
                             super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
                  }
                  uVar19 = 6;
                  uVar20 = 0;
                  if (pTVar7[-1] != Function) goto LAB_00160982;
                }
                local_2a0._M_dataplus._M_p = local_2a8;
                local_2a0.field_2._M_allocated_capacity = CONCAT44(uVar20,uVar19);
                local_2a0._M_string_length = (size_type)pcVar16;
                std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
                goto LAB_001609e2;
              }
              pwVar11 = pwVar11 + 1;
            } while (wVar12 != wVar10);
            if (local_2a8 < pcVar16) {
              local_2a0._M_string_length = (size_type)(pcVar16 + -1);
              local_2a0._M_dataplus._M_p = local_2a8;
              local_2a0.field_2._M_allocated_capacity = 1;
              std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
              emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
              local_2a8 = pcVar16;
            }
            local_2a0.field_2._M_allocated_capacity = 8;
            local_2a0._M_dataplus._M_p = local_2a8;
            local_2a0._M_string_length = (size_type)pcVar16;
            std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
            emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
          }
        }
LAB_001609e2:
        bVar14 = false;
        bVar18 = false;
        bVar17 = false;
        goto LAB_001602a6;
      }
      if (local_2a8 < pcVar16) {
        local_2a0._M_string_length = (size_type)(pcVar16 + -1);
        local_2a0._M_dataplus._M_p = local_2a8;
        local_2a0.field_2._M_allocated_capacity = 0;
        std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
        emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
        local_2a8 = pcVar16;
      }
      bVar17 = true;
      bVar4 = false;
      bVar14 = false;
      bVar18 = false;
      pcVar15 = pcVar16 + 1;
      goto LAB_0016022e;
    }
    bVar18 = true;
    bVar4 = false;
    bVar14 = false;
  }
  bVar17 = false;
  pcVar15 = pcVar16 + 1;
  goto LAB_0016022e;
code_r0x001602cc:
  bVar4 = false;
  pcVar15 = pcVar16 + 2;
  bVar14 = true;
  if (pwVar11[1] != L'\'') {
LAB_001602db:
    bVar4 = false;
    pcVar15 = pcVar16 + 1;
    bVar14 = wVar10 != L'\'';
  }
  goto LAB_0016022e;
  while (pcVar16 = pcVar15 + 1, pwVar11[(long)pcVar15] == L' ') {
LAB_00160b1d:
    pcVar15 = pcVar16;
    if (pcVar8 <= pcVar15) break;
  }
  local_2a0._M_string_length = (size_type)(pcVar15 + -1);
  local_2a0._M_dataplus._M_p = local_2a8;
  local_2a0.field_2._M_allocated_capacity = 10;
  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::emplace_back<xlfparser::Token>
            (__return_storage_ptr__,(Token *)&local_2a0);
  goto LAB_0016021a;
}

Assistant:

inline std::vector<Token> tokenize(const char_type *formula, size_t size, const Options<char_type>& options)
    {
        // Basic checks to make sure it's a valid formula
        if (size < 2 || formula[0] != '=')
            throw invalid_formula("Invalid Excel formula");

        // Chars used in parsing excel formual
        const char_type QUOTE_DOUBLE  = XLFP_CHAR('"');
        const char_type QUOTE_SINGLE  = XLFP_CHAR('\'');
        const char_type PAREN_OPEN    = XLFP_CHAR('(');
        const char_type PAREN_CLOSE   = XLFP_CHAR(')');
        const char_type WHITESPACE    = XLFP_CHAR(' ');
        const char_type ERROR_START   = XLFP_CHAR('#');

        // Some chars can be changed in the options
        const auto left_brace = options.left_brace.value_or(XLFP_CHAR('{'));
        const auto right_brace = options.right_brace.value_or(XLFP_CHAR('}'));
        const auto left_bracket = options.left_bracket.value_or(XLFP_CHAR('['));
        const auto right_bracket = options.right_brace.value_or(XLFP_CHAR(']'));
        const auto list_separator = options.list_separator.value_or(XLFP_CHAR(','));
        const auto decimal_separator = options.decimal_separator.value_or(XLFP_CHAR('.'));
        const auto row_separator = options.row_separator.value_or(XLFP_CHAR(';'));

        const char_type* OPERATORS_INFIX   = XLFP_STRING("+-*/^&=><@");
        const char_type* OPERATORS_POSTFIX = XLFP_STRING("%");

        // This matches a number in scientific notation with or without numbers after the + or -.
        // It's used to test for SN numbers before checking for +/- operators.
        std::basic_stringstream<char_type> sn_regex_ss;
        sn_regex_ss << R"(^[1-9](\)" << decimal_separator << R"(\d+)?E[+-]\d*$)";
        const std::basic_regex<char_type> sn_regex(sn_regex_ss.str(),
            std::regex_constants::ECMAScript |
            std::regex_constants::icase);

        const char_type* ERRORS[] = {
                XLFP_STRING("#NULL!"),
                XLFP_STRING("#DIV/0!"),
                XLFP_STRING("#VALUE!"),
                XLFP_STRING("#REF!"),
                XLFP_STRING("#NAME?"),
                XLFP_STRING("#NUM!"),
                XLFP_STRING("#N/A"),
                XLFP_STRING("#SPILL!"),
                NULL
        };

        const char_type* COMPARATORS_MULTI[] = {
                XLFP_STRING(">="),
                XLFP_STRING("<="),
                XLFP_STRING("<>"),
                NULL
        };

        bool in_string = false;
        bool in_path = false;
        bool in_range = false;
        bool in_error = false;

        std::vector<Token> tokens;
        std::stack<Token::Type> stack;

        size_t index = 1;  // first char is always '='
        size_t start = index;  // start of the current token
        while(index < size && formula[index] != L'\0')
        {
            // state-dependent character evaluation (order is important)

            // double-quoted strings
            // embeds are doubled
            // end marks token
            if (in_string) {
                if (formula[index] == QUOTE_DOUBLE)
                {
                    if (((index + 2) <= size) && (formula[index + 1] == QUOTE_DOUBLE))
                    {
                        // '""' is a quoted '"' so skip both
                        index += 2;
                        continue;
                    }

                    // add the string token, exit the string and continue
                    tokens.push_back(Token(start, index, Token::Type::Operand, Token::Subtype::Text));
                    start = ++index;
                    in_string = false;
                    continue;
                }

                ++index;
                continue;
            }

            // single-quoted strings (links)
            // embeds are double
            // end does not mark a token
            if (in_path)
            {
                if (formula[index] == QUOTE_SINGLE)
                {
                    if (((index + 2) <= size) && (formula[index + 1] == QUOTE_SINGLE))
                    {
                        // '' is a quoted ' so skip both
                        index += 2;
                        continue;
                    }

                    in_path = false;
                }

                ++index;
                continue;
            }

            // bracketed strings (R1C1 range index or linked workbook name)
            // no embeds (changed to "()" by Excel)
            // end does not mark a token
            if (in_range)
            {
                if (formula[index] == right_bracket)
                    in_range = false;

                index++;
                continue;
            }

            // error values
            // end marks a token, determined from absolute list of values
            if (in_error)
            {
                for (auto err = &ERRORS[0]; *err != NULL; ++err)
                {
                    if (_str_equals(*err, _tcslen(*err), &formula[start], 1 + index - start))
                    {
                        // add the string token, exit the string and continue
                        tokens.push_back(Token(start, index, Token::Type::Operand, Token::Subtype::Error));
                        start = index + 1;
                        in_error = false;
                        break;
                    }
                }

                ++index;
                continue;
            }

            // scientific notation check
            if (index > start)
            {
                if (std::regex_match(&formula[start], &formula[index]+1, sn_regex))
                {
                    ++index;
                    continue;
                }
            }

            // independent character evaluation (order not important)
            // establish state-dependent character evaluations
            if (formula[index] == QUOTE_DOUBLE) {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Unknown, Token::Subtype::None));
                    start = index;
                }

                in_string = true;
                ++index;
                continue;
            }

            if (formula[index] == QUOTE_SINGLE)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Unknown, Token::Subtype::None));
                    start = index;
                }

                in_path = true;
                ++index;
                continue;
            }

            if (formula[index] == left_bracket)
            {
                in_range = true;
                ++index;
                continue;
            }

            if (formula[index] == ERROR_START)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Unknown, Token::Subtype::None));
                    start = index;
                }

                in_error = true;
                ++index;
                continue;
            }

            // mark start and end of arrays and array rows
            if (formula[index] == left_brace)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Unknown, Token::Subtype::None));
                    start = index;
                }

                tokens.push_back(Token(start, index, Token::Type::Array, Token::Subtype::Start));
                tokens.push_back(Token(start, index, Token::Type::ArrayRow, Token::Subtype::Start));

                stack.push(Token::Type::Array);
                stack.push(Token::Type::ArrayRow);

                start = ++index;
                continue;
            }

            if (formula[index] == row_separator && !stack.empty() && stack.top() == Token::Type::ArrayRow)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                tokens.push_back(Token(start, index, stack.top(), Token::Subtype::Stop));
                stack.pop();

                tokens.push_back(Token(start, index, Token::Type::ArrayRow, Token::Subtype::Start));
                stack.push(Token::Type::ArrayRow);

                start = ++index;
                continue;
            }

            if (formula[index] == right_brace)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                if (stack.empty())
                    throw invalid_formula("Mismatched braces");

                tokens.push_back(Token(start, index, stack.top(), Token::Subtype::Stop));
                stack.pop();

                tokens.push_back(Token(start, index, stack.top(), Token::Subtype::Stop));
                stack.pop();

                start = ++index;
                continue;
            }

            // trim white-space
            if (formula[index] == WHITESPACE)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                while ((formula[index] == WHITESPACE) && (index < size))
                    index++;

                tokens.push_back(Token(start, index-1, Token::Type::Whitespace, Token::Subtype::None));

                start = index;
                continue;
            }

            // multi-character comparators
            if ((index + 2) <= size)
            {
                bool foundOp = false;
                for (auto op = &COMPARATORS_MULTI[0]; *op != NULL; ++op)
                {
                    if (_str_equals(*op, _tcslen(*op), &formula[index], 2))
                    {
                        if (index > start)
                        {
                            tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                            start = index;
                        }

                        tokens.push_back(Token(start, index+1, Token::Type::OperatorInfix, Token::Subtype::Logical));
                        foundOp = true;
                        break;
                    }
                }

                if (foundOp)
                {
                    index += 2;
                    start = index;
                    continue;
                }
            }

            // standard infix operators
            bool foundOp = false;
            for (auto op = OPERATORS_INFIX; *op != L'\0'; ++op)
            {
                if (*op == formula[index])
                {
                    if (index > start)
                    {
                        tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                        start = index;
                    }

                    tokens.push_back(Token(start, index, Token::Type::OperatorInfix, Token::Subtype::None));
                    foundOp = true;
                    break;
                }
            }

            if (foundOp)
            {
                start = ++index;
                continue;
            }

            // standard postfix operators
            for (auto op = OPERATORS_POSTFIX; *op != L'\0'; ++op)
            {
                if (*op == formula[index])
                {
                    if (index > start)
                    {
                        tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                        start = index;
                    }

                    tokens.push_back(Token(start, index, Token::Type::OperatorPostfix, Token::Subtype::None));
                    foundOp = true;
                    break;
                }
            }

            if (foundOp)
            {
                start = ++index;
                continue;
            }

            // start subexpression or function
            if (formula[index] == PAREN_OPEN)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Function, Token::Subtype::Start));
                    stack.push(Token::Type::Function);
                }
                else
                {
                    tokens.push_back(Token(start, index, Token::Type::Subexpression, Token::Subtype::Start));
                    stack.push(Token::Type::Subexpression);
                }

                start = ++index;
                continue;
            }

            // function, subexpression, or array parameters, or operand unions
            if (formula[index] == list_separator)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                auto type = (!stack.empty() && stack.top() == Token::Type::Function)
                                ? std::make_tuple(Token::Type::Argument, Token::Subtype::None)
                                : std::make_tuple(Token::Type::OperatorInfix, Token::Subtype::Union);

                tokens.push_back(Token(start, index, std::get<0>(type), std::get<1>(type)));

                start = ++index;
                continue;
            }

            // stop subexpression
            if (formula[index] == PAREN_CLOSE)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                if (stack.empty())
                    throw invalid_formula("Mismatched parentheses");

                tokens.push_back(Token(start, index, stack.top(), Token::Subtype::Stop));
                stack.pop();

                start = ++index;
                continue;
            }

            // token accumulation
            ++index;
        }

        // dump remaining accumulation, if any
        if (index > start && (tokens.empty() || tokens.back().end() < start))
            tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));

        // label intersection operators specified as whitespace correctly
        tokens = _fix_whitespace_tokens(tokens, formula, size);

        // set the token subtypes correctly
        _infer_token_subtypes(tokens, options, formula, size);

        return tokens;
    }